

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateStaticMembers
          (SingularString *this,Printer *p)

{
  if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
      (string *)0x0) {
    io::Printer::Emit(p,0,0,0x43,
                      "\n      static const $pbi$::LazyString $default_variable_name$;\n    ");
  }
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    io::Printer::Emit(p,0,0,0x39,"\n      static ::std::true_type _init_inline_$name$_;\n    ");
    return;
  }
  return;
}

Assistant:

void SingularString::GenerateStaticMembers(io::Printer* p) const {
  if (!EmptyDefault()) {
    p->Emit(R"cc(
      static const $pbi$::LazyString $default_variable_name$;
    )cc");
  }
  if (is_inlined()) {
    // `_init_inline_xxx` is used for initializing default instances.
    p->Emit(R"cc(
      static ::std::true_type _init_inline_$name$_;
    )cc");
  }
}